

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  byte bVar1;
  int iVar2;
  TValue *pTVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(L->glref).ptr32;
  if (errfunc == 0) {
    lVar4 = 0;
  }
  else {
    if (errfunc < 1) {
      pTVar3 = L->top + errfunc;
    }
    else {
      pTVar3 = (TValue *)(uVar5 + 0x68);
      if (L->base + ((ulong)(uint)errfunc - 1) < L->top) {
        pTVar3 = L->base + ((ulong)(uint)errfunc - 1);
      }
    }
    lVar4 = (long)pTVar3 - (ulong)(L->stack).ptr32;
  }
  bVar1 = *(byte *)(uVar5 + 0x91);
  iVar2 = lj_vm_pcall(L,L->top + -(long)nargs,nresults + 1,lVar4);
  if (iVar2 != 0) {
    *(byte *)(uVar5 + 0x91) = *(byte *)(uVar5 + 0x91) & 0xf | bVar1 & 0xf0;
  }
  return iVar2;
}

Assistant:

LUA_API int lua_pcall(lua_State *L, int nargs, int nresults, int errfunc)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  ptrdiff_t ef;
  int status;
  api_check(L, L->status == 0 || L->status == LUA_ERRERR);
  api_checknelems(L, nargs+1);
  if (errfunc == 0) {
    ef = 0;
  } else {
    cTValue *o = stkindex2adr(L, errfunc);
    api_checkvalidindex(L, o);
    ef = savestack(L, o);
  }
  status = lj_vm_pcall(L, L->top - nargs, nresults+1, ef);
  if (status) hook_restore(g, oldh);
  return status;
}